

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  u8 *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int *pOld;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int nPos;
  i64 iDelta;
  int bDummy;
  int local_4c;
  Fts5Index *local_48;
  u64 local_40;
  int local_34;
  
  iVar1 = p->pConfig->eDetail;
  iVar5 = pIter->pLeaf->szLeaf;
  iVar6 = pIter->iLeafOffset;
  puVar2 = pIter->pLeaf->p;
  iVar4 = pIter->iEndofDoclist;
  if (iVar5 < pIter->iEndofDoclist) {
    iVar4 = iVar5;
  }
  lVar10 = 0;
  local_48 = p;
  do {
    local_40 = 0;
    lVar8 = (long)iVar6;
    if (iVar1 == 1) {
      iVar5 = iVar6;
      if ((iVar6 < iVar4) && (puVar2[lVar8] == '\0')) {
        iVar7 = (int)(lVar8 + 1);
        iVar5 = iVar7;
        if ((iVar7 < iVar4) && (iVar5 = iVar6 + 2, puVar2[lVar8 + 1] != '\0')) {
          iVar5 = iVar7;
        }
      }
    }
    else {
      iVar5 = fts5GetPoslistSize(puVar2 + lVar8,&local_4c,&local_34);
      iVar5 = iVar5 + iVar6 + local_4c;
    }
    if (iVar4 <= iVar5) goto LAB_00190054;
    bVar3 = sqlite3Fts5GetVarint(puVar2 + iVar5,&local_40);
    pIter->iRowid = pIter->iRowid + local_40;
    iVar7 = pIter->nRowidOffset;
    pOld = pIter->aRowidOffset;
    iVar9 = iVar6;
    if (iVar7 <= lVar10) {
      pOld = (int *)sqlite3_realloc64(pOld,(long)iVar7 * 4 + 0x20);
      if (pOld == (int *)0x0) {
        local_48->rc = 7;
LAB_00190054:
        pIter->iRowidOffset = (int)lVar10;
        fts5SegIterLoadNPos(local_48,pIter);
        return;
      }
      pIter->aRowidOffset = pOld;
      pIter->nRowidOffset = iVar7 + 8;
      iVar9 = pIter->iLeafOffset;
    }
    iVar6 = iVar5 + (uint)bVar3;
    pOld[lVar10] = iVar9;
    lVar10 = lVar10 + 1;
    pIter->iLeafOffset = iVar6;
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    i64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}